

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O1

uint32_t read_uint32(dwarf_buf *buf)

{
  int iVar1;
  uint uVar2;
  byte *pbVar3;
  
  pbVar3 = buf->buf;
  iVar1 = advance(buf,4);
  if (iVar1 == 0) {
    uVar2 = 0;
  }
  else {
    if (buf->is_bigendian == 0) {
      uVar2 = (uint)pbVar3[1] << 8 | (uint)pbVar3[2] << 0x10 | (uint)pbVar3[3] << 0x18;
    }
    else {
      uVar2 = (uint)pbVar3[2] << 8 | (uint)pbVar3[1] << 0x10 | (uint)*pbVar3 << 0x18;
      pbVar3 = pbVar3 + 3;
    }
    uVar2 = *pbVar3 | uVar2;
  }
  return uVar2;
}

Assistant:

static uint32_t
read_uint32 (struct dwarf_buf *buf)
{
  const unsigned char *p = buf->buf;

  if (!advance (buf, 4))
    return 0;
  if (buf->is_bigendian)
    return (((uint32_t) p[0] << 24) | ((uint32_t) p[1] << 16)
	    | ((uint32_t) p[2] << 8) | (uint32_t) p[3]);
  else
    return (((uint32_t) p[3] << 24) | ((uint32_t) p[2] << 16)
	    | ((uint32_t) p[1] << 8) | (uint32_t) p[0]);
}